

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void test<int>(int expected,string *value)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  char *in_R9;
  AssertHelper local_c0;
  Message local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_1;
  int result2;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  string local_70;
  AssertHelper local_50 [3];
  Message local_38;
  undefined1 local_30 [8];
  AssertionResult gtest_ar_;
  int result;
  bool valid;
  string *value_local;
  int expected_local;
  
  value_local._4_4_ = expected;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  lVar3 = std::__cxx11::string::c_str();
  lVar4 = std::__cxx11::string::size();
  gtest_ar_.message_.ptr_._0_4_ =
       jsteemann::atoi<int>
                 (pcVar2,(char *)(lVar3 + lVar4),(bool *)((long)&gtest_ar_.message_.ptr_ + 7));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_30,(bool *)((long)&gtest_ar_.message_.ptr_ + 7),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(internal *)local_30,(AssertionResult *)0x193d6c,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp",
               0x18,pcVar2);
    testing::internal::AssertHelper::operator=(local_50,&local_38);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    std::__cxx11::string::~string((string *)&local_70);
    testing::Message::~Message(&local_38);
  }
  gtest_ar.message_.ptr_._5_3_ = 0;
  gtest_ar.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  if (gtest_ar.message_.ptr_._4_4_ == 0) {
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_88,"expected","result",(int *)((long)&value_local + 4),
               (int *)&gtest_ar_.message_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffff68,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp"
                 ,0x19,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff68,&local_90)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff68);
      testing::Message::~Message(&local_90);
    }
    gtest_ar.message_.ptr_._5_3_ = 0;
    gtest_ar.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    if (gtest_ar.message_.ptr_._4_4_ == 0) {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      lVar3 = std::__cxx11::string::c_str();
      lVar4 = std::__cxx11::string::size();
      gtest_ar_1.message_.ptr_._4_4_ =
           jsteemann::atoi_unchecked<int>(pcVar2,(char *)(lVar3 + lVar4));
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_b0,"expected","result2",(int *)((long)&value_local + 4),
                 (int *)((long)&gtest_ar_1.message_.ptr_ + 4));
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
      if (!bVar1) {
        testing::Message::Message(&local_b8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp"
                   ,0x1c,pcVar2);
        testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        testing::Message::~Message(&local_b8);
      }
      gtest_ar.message_.ptr_._5_3_ = 0;
      gtest_ar.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
    }
  }
  return;
}

Assistant:

static void test(T expected, std::string const& value) {
  bool valid;
  T result = jsteemann::atoi<T>(value.c_str(), value.c_str() + value.size(), valid);
  ASSERT_TRUE(valid);
  ASSERT_EQ(expected, result);
  
  T result2 = jsteemann::atoi_unchecked<T>(value.c_str(), value.c_str() + value.size());
  ASSERT_EQ(expected, result2);
}